

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa_test.cc
# Opt level: O2

void __thiscall DSATest_ZeroPrivateKey_Test::TestBody(DSATest_ZeroPrivateKey_Test *this)

{
  pointer *this_00;
  UniquePtr<BIGNUM> priv_key;
  int iVar1;
  char *in_R9;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_80;
  UniquePtr<BIGNUM> zero;
  AssertionResult gtest_ar__3;
  UniquePtr<DSA> dsa;
  string local_58;
  AssertHelper local_38;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sig;
  uint sig_len;
  
  GetFIPSDSA();
  this_00 = &sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
  sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       (__uniq_ptr_impl<dsa_st,_bssl::internal::Deleter>)
       dsa._M_t.super___uniq_ptr_impl<dsa_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_dsa_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_dsa_st_*,_false>._M_head_impl !=
       (__uniq_ptr_impl<dsa_st,_bssl::internal::Deleter>)0x0;
  if ((__uniq_ptr_impl<dsa_st,_bssl::internal::Deleter>)
      dsa._M_t.super___uniq_ptr_impl<dsa_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_dsa_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_dsa_st_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<dsa_st,_bssl::internal::Deleter>)0x0) {
    testing::Message::Message((Message *)&gtest_ar__3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_58,(internal *)&sig,(AssertionResult *)0x5222fa,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&zero,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dsa/dsa_test.cc"
               ,0x120,local_58._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&zero,(Message *)&gtest_ar__3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&zero);
    std::__cxx11::string::~string((string *)&local_58);
    if ((long *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_) + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_00);
    goto LAB_0023c1be;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00);
  zero._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)BN_new();
  sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       (tuple<bignum_st_*,_bssl::internal::Deleter>)
       zero._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
       (_Head_base<0UL,_bignum_st_*,_false>)0x0;
  if ((tuple<bignum_st_*,_bssl::internal::Deleter>)
      zero._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl ==
      (_Head_base<0UL,_bignum_st_*,_false>)0x0) {
    testing::Message::Message((Message *)&gtest_ar__3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_58,(internal *)&sig,(AssertionResult *)0x48c0ff,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dsa/dsa_test.cc"
               ,0x122,local_58._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&gtest_ar__3);
LAB_0023c188:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    std::__cxx11::string::~string((string *)&local_58);
    if ((long *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_) + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish);
    priv_key._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
         zero._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl;
    zero._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0;
    iVar1 = DSA_set0_key((DSA *)dsa._M_t.super___uniq_ptr_impl<dsa_st,_bssl::internal::Deleter>._M_t
                                .super__Tuple_impl<0UL,_dsa_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_dsa_st_*,_false>._M_head_impl,(BIGNUM *)0x0,
                         (BIGNUM *)
                         priv_key._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                         _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
    sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = iVar1 != 0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&gtest_ar__3);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_58,(internal *)&sig,
                 (AssertionResult *)"DSA_set0_key(dsa.get(), nullptr, zero.release())","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_80,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dsa/dsa_test.cc"
                 ,0x124,local_58._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&gtest_ar__3);
      goto LAB_0023c188;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish);
    iVar1 = DSA_size((DSA *)dsa._M_t.super___uniq_ptr_impl<dsa_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_dsa_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_dsa_st_*,_false>._M_head_impl);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&sig,(long)iVar1,(allocator_type *)&local_58);
    iVar1 = DSA_sign(0,"",0x20,
                     (uchar *)CONCAT71(sig.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                       sig.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_1_),&sig_len,
                     (DSA *)dsa._M_t.super___uniq_ptr_impl<dsa_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_dsa_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_dsa_st_*,_false>._M_head_impl);
    gtest_ar__3.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar__3.success_ = iVar1 == 0;
    if (!gtest_ar__3.success_) {
      testing::Message::Message((Message *)&local_80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_58,(internal *)&gtest_ar__3,
                 (AssertionResult *)
                 "DSA_sign(0, kZeroDigest, sizeof(kZeroDigest), sig.data(), &sig_len, dsa.get())",
                 "true","false",
                 (char *)dsa._M_t.super___uniq_ptr_impl<dsa_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_dsa_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_dsa_st_*,_false>._M_head_impl);
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dsa/dsa_test.cc"
                 ,0x12a,local_58._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      std::__cxx11::string::~string((string *)&local_58);
      if (local_80._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_80._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar__3.message_);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&zero);
LAB_0023c1be:
  std::unique_ptr<dsa_st,_bssl::internal::Deleter>::~unique_ptr(&dsa);
  return;
}

Assistant:

TEST(DSATest, ZeroPrivateKey) {
  bssl::UniquePtr<DSA> dsa = GetFIPSDSA();
  ASSERT_TRUE(dsa);
  bssl::UniquePtr<BIGNUM> zero(BN_new());
  ASSERT_TRUE(zero);
  ASSERT_TRUE(DSA_set0_key(dsa.get(), /*pub_key=*/nullptr,
                           /*priv_key=*/zero.release()));

  static const uint8_t kZeroDigest[32] = {0};
  std::vector<uint8_t> sig(DSA_size(dsa.get()));
  unsigned sig_len;
  EXPECT_FALSE(DSA_sign(0, kZeroDigest, sizeof(kZeroDigest), sig.data(),
                        &sig_len, dsa.get()));
}